

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabUnlock(VTable *pVTab)

{
  undefined8 *in_RDI;
  sqlite3_vtab *p;
  sqlite3 *db;
  long *p_00;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)*in_RDI;
  *(int *)(in_RDI + 3) = *(int *)(in_RDI + 3) + -1;
  if (*(int *)(in_RDI + 3) == 0) {
    p_00 = (long *)in_RDI[2];
    if (p_00 != (long *)0x0) {
      (**(code **)(*p_00 + 0x20))(p_00);
    }
    sqlite3DbFree(db_00,p_00);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabUnlock(VTable *pVTab){
  sqlite3 *db = pVTab->db;

  assert( db );
  assert( pVTab->nRef>0 );
  assert( db->magic==SQLITE_MAGIC_OPEN || db->magic==SQLITE_MAGIC_ZOMBIE );

  pVTab->nRef--;
  if( pVTab->nRef==0 ){
    sqlite3_vtab *p = pVTab->pVtab;
    if( p ){
      p->pModule->xDisconnect(p);
    }
    sqlite3DbFree(db, pVTab);
  }
}